

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterBasic.cpp
# Opt level: O1

SharedPtr<Filter> __thiscall
Rml::FilterBasicInstancer::InstanceFilter
          (FilterBasicInstancer *this,String *name,PropertyDictionary *properties)

{
  FilterBasic *pFVar1;
  Property *this_00;
  PropertyDictionary *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  float fVar3;
  SharedPtr<Filter> SVar4;
  SharedPtr<Rml::FilterBasic> filter;
  undefined1 local_31;
  undefined8 local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  this_00 = PropertyDictionary::GetProperty(in_RCX,name[3].field_2._M_local_buf[8]);
  if (this_00 == (Property *)0x0) {
    (this->super_FilterInstancer)._vptr_FilterInstancer = (_func_int **)0x0;
    (this->super_FilterInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    local_30 = (FilterBasic *)((ulong)local_30._4_4_ << 0x20);
    Variant::GetInto<float,_0>(&this_00->value,(float *)&local_30);
    if (this_00->unit == DEG) {
      fVar3 = Math::DegreesToRadians((float)local_30);
    }
    else {
      fVar3 = (float)local_30;
      if (this_00->unit == PERCENT) {
        fVar3 = (float)local_30 * 0.01;
      }
    }
    local_30 = (FilterBasic *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Rml::FilterBasic,std::allocator<Rml::FilterBasic>>
              (&local_28,(FilterBasic **)&local_30,(allocator<Rml::FilterBasic> *)&local_31);
    pFVar1 = local_30;
    ::std::__cxx11::string::_M_assign((string *)&local_30->name);
    pFVar1->value = fVar3;
    (this->super_FilterInstancer)._vptr_FilterInstancer = (_func_int **)local_30;
    (this->super_FilterInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->super_FilterInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_28._M_pi;
    _Var2._M_pi = extraout_RDX_00;
  }
  SVar4.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  SVar4.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SharedPtr<Filter>)SVar4.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Filter> FilterBasicInstancer::InstanceFilter(const String& name, const PropertyDictionary& properties)
{
	const Property* p_value = properties.GetProperty(ids.value);
	if (!p_value)
		return nullptr;

	float value = p_value->Get<float>();
	if (p_value->unit == Unit::PERCENT)
		value *= 0.01f;
	else if (p_value->unit == Unit::DEG)
		value = Rml::Math::DegreesToRadians(value);

	auto filter = MakeShared<FilterBasic>();
	if (filter->Initialise(name, value))
		return filter;

	return nullptr;
}